

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLUri::initializeScheme(XMLUri *this,XMLCh *uriSpec)

{
  MemoryManager *pMVar1;
  int iVar2;
  XMLCh *pXVar3;
  MalformedURLException *this_00;
  XMLSize_t XVar4;
  undefined4 extraout_var;
  undefined1 local_48 [8];
  ArrayJanitor<char16_t> tmpName;
  XMLCh *scheme;
  XMLCh *tmpPtr;
  XMLCh *uriSpec_local;
  XMLUri *this_local;
  
  pXVar3 = XMLString::findAny(uriSpec,(XMLCh *)SCHEME_SEPARATORS);
  if (pXVar3 == (XMLCh *)0x0) {
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x32b,XMLNUM_URI_No_Scheme,this->fMemoryManager);
    __cxa_throw(this_00,&MalformedURLException::typeinfo,
                MalformedURLException::~MalformedURLException);
  }
  pMVar1 = this->fMemoryManager;
  XVar4 = XMLString::stringLen(uriSpec);
  iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,XVar4 * 2 + 2);
  tmpName.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar2);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)local_48,(char16_t *)tmpName.fMemoryManager,
             this->fMemoryManager);
  XMLString::subString
            ((XMLCh *)tmpName.fMemoryManager,uriSpec,0,(long)pXVar3 - (long)uriSpec >> 1,
             this->fMemoryManager);
  setScheme(this,(XMLCh *)tmpName.fMemoryManager);
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_48);
  return;
}

Assistant:

void XMLUri::initializeScheme(const XMLCh* const uriSpec)
{
    const XMLCh* tmpPtr = XMLString::findAny(uriSpec, SCHEME_SEPARATORS);

    if ( !tmpPtr )
    {
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::XMLNUM_URI_No_Scheme, fMemoryManager);
    }
	else
    {
        XMLCh* scheme = (XMLCh*) fMemoryManager->allocate
        (
            (XMLString::stringLen(uriSpec) + 1) * sizeof(XMLCh)
        );//new XMLCh[XMLString::stringLen(uriSpec)+1];
        ArrayJanitor<XMLCh> tmpName(scheme, fMemoryManager);
        XMLString::subString(scheme, uriSpec, 0, (tmpPtr - uriSpec), fMemoryManager);
        setScheme(scheme);
	}

}